

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O2

void init_error_limit(j_decompress_ptr cinfo)

{
  _func_void_j_decompress_ptr *p_Var1;
  jpeg_color_quantizer *pjVar2;
  void *pvVar3;
  int *piVar4;
  undefined4 *puVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  pjVar2 = cinfo->cquantize;
  pvVar3 = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x7fc);
  p_Var1 = (_func_void_j_decompress_ptr *)((long)pvVar3 + 0x3fc);
  pjVar2[2].finish_pass = p_Var1;
  lVar8 = 0;
  for (lVar7 = 0; lVar7 != -0x10; lVar7 = lVar7 + -1) {
    *(int *)(p_Var1 + lVar8 * 4) = (int)lVar8;
    *(int *)(p_Var1 + lVar7 * 4) = (int)lVar7;
    lVar8 = lVar8 + 1;
  }
  piVar4 = (int *)((long)pvVar3 + 0x3bc);
  iVar6 = 0x10;
  for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
    *(int *)((long)pvVar3 + lVar7 * 4 + 0x43c) = iVar6;
    *piVar4 = -iVar6;
    iVar6 = iVar6 + ((int)lVar7 + 0x10U & 1);
    piVar4 = piVar4 + -1;
  }
  puVar5 = (undefined4 *)((long)pvVar3 + 0x33c);
  for (lVar7 = 0; lVar7 != 0xd0; lVar7 = lVar7 + 1) {
    *(undefined4 *)((long)pvVar3 + lVar7 * 4 + 0x4bc) = 0x20;
    *puVar5 = 0xffffffe0;
    puVar5 = puVar5 + -1;
  }
  return;
}

Assistant:

LOCAL(void)
init_error_limit(j_decompress_ptr cinfo)
/* Allocate and fill in the error_limiter table */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  int *table;
  int in, out;

  table = (int *)(*cinfo->mem->alloc_small)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, (MAXJSAMPLE * 2 + 1) * sizeof(int));
  table += MAXJSAMPLE;          /* so can index -MAXJSAMPLE .. +MAXJSAMPLE */
  cquantize->error_limiter = table;

#define STEPSIZE  ((MAXJSAMPLE + 1) / 16)
  /* Map errors 1:1 up to +- MAXJSAMPLE/16 */
  out = 0;
  for (in = 0; in < STEPSIZE; in++, out++) {
    table[in] = out;  table[-in] = -out;
  }
  /* Map errors 1:2 up to +- 3*MAXJSAMPLE/16 */
  for (; in < STEPSIZE * 3; in++, out += (in & 1) ? 0 : 1) {
    table[in] = out;  table[-in] = -out;
  }
  /* Clamp the rest to final out value (which is (MAXJSAMPLE+1)/8) */
  for (; in <= MAXJSAMPLE; in++) {
    table[in] = out;  table[-in] = -out;
  }
#undef STEPSIZE
}